

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

EssenceContainerData * __thiscall
ASDCP::MXF::EssenceContainerData::WriteToTLVSet(EssenceContainerData *this,TLVWriter *TLVSet)

{
  bool bVar1;
  int iVar2;
  MDDEntry *pMVar3;
  MDDEntry *pMVar4;
  MDDEntry *in_RDX;
  TLVWriter local_170;
  TLVWriter local_108;
  TLVWriter local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVWriter *TLVSet_local;
  EssenceContainerData *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOWriter.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x191,
                  "virtual ASDCP::Result_t ASDCP::MXF::EssenceContainerData::WriteToTLVSet(TLVWriter &)"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  InterchangeObject::WriteToTLVSet(&this->super_InterchangeObject,TLVSet);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_EssenceContainerData_LinkedPackageUID);
    TLVWriter::WriteObject(&local_a0,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<unsigned_int>::empty
                        ((optional_property<unsigned_int> *)&TLVSet[2].m_Lookup), pMVar4 = local_20,
     !bVar1)) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,MDD_Core_IndexSID);
    optional_property<unsigned_int>::get((optional_property<unsigned_int> *)&TLVSet[2].m_Lookup);
    TLVWriter::WriteUi32(&local_108,pMVar4,(ui32_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar2) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,MDD_Core_BodySID);
    TLVWriter::WriteUi32(&local_170,local_20,(ui32_t *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_170);
    Kumu::Result_t::~Result_t((Result_t *)&local_170);
  }
  return this;
}

Assistant:

ASDCP::Result_t
EssenceContainerData::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(EssenceContainerData, LinkedPackageUID));
  if ( ASDCP_SUCCESS(result)  && ! IndexSID.empty() ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS_OPT(EssenceContainerData, IndexSID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(EssenceContainerData, BodySID));
  return result;
}